

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

int __thiscall crnlib::dxt_image::init(dxt_image *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  element *peVar2;
  undefined4 in_EDX;
  uint height;
  byte in_R8B;
  dxt_image *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  undefined1 uVar3;
  
  height = (uint)ctx;
  this_00 = this;
  bVar1 = init_internal((dxt_image *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                        (dxt_format)((ulong)this >> 0x20),(uint)this,height);
  if (bVar1) {
    vector<crnlib::dxt_image::element>::resize
              (&this_00->m_elements,height,SUB41((uint)in_EDX >> 0x18,0));
    peVar2 = vector<crnlib::dxt_image::element>::operator[](&this->m_elements,0);
    this->m_pElements = peVar2;
    if ((in_R8B & 1) != 0) {
      this = (dxt_image *)memset(this->m_pElements,0,(ulong)this->m_total_elements << 3);
    }
    uVar3 = 1;
  }
  else {
    uVar3 = 0;
    this = (dxt_image *)CONCAT71(extraout_var,bVar1);
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),uVar3);
}

Assistant:

bool dxt_image::init(dxt_format fmt, uint width, uint height, bool clear_elements) {
  if (!init_internal(fmt, width, height))
    return false;

  m_elements.resize(m_total_elements);
  m_pElements = &m_elements[0];

  if (clear_elements)
    memset(m_pElements, 0, sizeof(element) * m_total_elements);

  return true;
}